

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

char * readfile(FILE *fp,size_t *bytes)

{
  size_t sVar1;
  size_t *in_RSI;
  FILE *in_RDI;
  size_t cnt;
  char *buf;
  char *local_8;
  
  sVar1 = filesize((FILE *)0x1023e8);
  *in_RSI = sVar1;
  local_8 = (char *)malloc(*in_RSI);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    rewind(in_RDI);
    sVar1 = fread(local_8,1,*in_RSI,in_RDI);
    if (*in_RSI != sVar1) {
      free(local_8);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char* readfile(FILE* fp, size_t* bytes) {
    *bytes = filesize(fp);
    char* buf = (char*)malloc(*bytes);
    if (buf == NULL) return NULL;

    rewind(fp);

    size_t cnt = fread(buf, 1, *bytes, fp);
    if (*bytes != cnt) {
        free(buf);
        return NULL;
    }
    return buf;
}